

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::AssignmentExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
          (AssignmentExpression *this,ConstraintExprVisitor *visitor)

{
  Expression *in_RSI;
  AssignmentExpression *in_RDI;
  
  if (in_RDI->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<slang::ast::ConstraintExprVisitor>
              ((TimingControl *)in_RDI,(ConstraintExprVisitor *)in_RSI);
  }
  left(in_RDI);
  Expression::visit<slang::ast::ConstraintExprVisitor&>(in_RSI,(ConstraintExprVisitor *)in_RDI);
  right(in_RDI);
  Expression::visit<slang::ast::ConstraintExprVisitor&>(in_RSI,(ConstraintExprVisitor *)in_RDI);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }